

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void test(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  double dVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int32_t iVar7;
  ulong uVar8;
  ostream *poVar9;
  uint i;
  string *psVar10;
  pointer pbVar11;
  int32_t local_354;
  real local_350;
  allocator<char> local_349;
  shared_ptr<const_fasttext::Dictionary> dict;
  undefined1 local_338 [112];
  bool local_2c8;
  FastText fasttext;
  ifstream ifs;
  
  bVar4 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1,"test-label");
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (((long)uVar8 >> 5) - 7U < 0xfffffffffffffffd) {
    if (bVar4) {
      printTestLabelUsage();
    }
    else {
      printTestUsage();
    }
LAB_00106fcc:
    exit(1);
  }
  if ((ulong)((long)uVar8 >> 5) < 5) {
    local_354 = 1;
    pbVar11 = pbVar1;
  }
  else {
    local_354 = std::__cxx11::stoi(pbVar1 + 4,(size_t *)0x0,10);
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11;
  }
  local_350 = 0.0;
  if (0xa0 < uVar8) {
    local_350 = std::__cxx11::stof(pbVar11 + 5,(size_t *)0x0);
  }
  ::fasttext::FastText::FastText(&fasttext);
  ::fasttext::FastText::loadModel(&fasttext,pbVar1 + 2);
  local_338._56_8_ = local_338 + 0x68;
  local_338._48_8_ = (element_type *)0x0;
  local_338._32_8_ = (element_type *)0x0;
  local_338._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_338._16_8_ = (element_type *)0x0;
  local_338._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_338._0_8_ = (element_type *)0x0;
  local_338._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_338._64_8_ = 1;
  local_338._72_8_ = (_Hash_node_base *)0x0;
  local_338._80_8_ = 0;
  local_338._88_8_ = 0x3f800000;
  local_338._96_8_ =
       (__uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>)0x0;
  local_338._104_8_ = (__node_base_ptr)0x0;
  local_2c8 = false;
  bVar5 = std::operator==(pbVar1 + 3,"-");
  if (bVar5) {
    ::fasttext::FastText::test
              (&fasttext,(istream *)&std::cin,local_354,local_350,(Meter *)local_338);
  }
  else {
    std::ifstream::ifstream(&ifs,(string *)(pbVar1 + 3),_S_in);
    cVar6 = std::__basic_file<char>::is_open();
    if (cVar6 == '\0') {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Test file cannot be opened!");
      std::endl<char,std::char_traits<char>>(poVar9);
      goto LAB_00106fcc;
    }
    ::fasttext::FastText::test(&fasttext,(istream *)&ifs,local_354,local_350,(Meter *)local_338);
    std::ifstream::~ifstream(&ifs);
  }
  lVar3 = std::cout;
  if (bVar4) {
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar3 + -0x18)) = 6;
    ::fasttext::FastText::getDictionary((FastText *)&dict);
    i = 0;
    while( true ) {
      iVar7 = ::fasttext::Dictionary::nlabels
                        (dict.
                         super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      if (iVar7 <= (int)i) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)&ifs,"F1-Score",&local_349);
      psVar10 = (string *)(ulong)i;
      dVar2 = ::fasttext::Meter::f1Score((Meter *)local_338,i);
      test::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&ifs,psVar10,dVar2);
      std::__cxx11::string::~string((string *)&ifs);
      std::__cxx11::string::string<std::allocator<char>>((string *)&ifs,"Precision",&local_349);
      psVar10 = (string *)(ulong)i;
      dVar2 = ::fasttext::Meter::precision((Meter *)local_338,i);
      test::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&ifs,psVar10,dVar2);
      std::__cxx11::string::~string((string *)&ifs);
      std::__cxx11::string::string<std::allocator<char>>((string *)&ifs,"Recall",&local_349);
      psVar10 = (string *)(ulong)i;
      dVar2 = ::fasttext::Meter::recall((Meter *)local_338,i);
      test::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&ifs,psVar10,dVar2);
      std::__cxx11::string::~string((string *)&ifs);
      poVar9 = std::operator<<((ostream *)&std::cout," ");
      ::fasttext::Dictionary::getLabel_abi_cxx11_
                ((string *)&ifs,
                 dict.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,i);
      poVar9 = std::operator<<(poVar9,(string *)&ifs);
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::string::~string((string *)&ifs);
      i = i + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&dict.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  ::fasttext::Meter::writeGeneralMetrics((Meter *)local_338,(ostream *)&std::cout,local_354);
  exit(0);
}

Assistant:

void test(const std::vector<std::string>& args) {
  bool perLabel = args[1] == "test-label";

  if (args.size() < 4 || args.size() > 6) {
    perLabel ? printTestLabelUsage() : printTestUsage();
    exit(EXIT_FAILURE);
  }

  const auto& model = args[2];
  const auto& input = args[3];
  int32_t k = args.size() > 4 ? std::stoi(args[4]) : 1;
  real threshold = args.size() > 5 ? std::stof(args[5]) : 0.0;

  FastText fasttext;
  fasttext.loadModel(model);

  Meter meter(false);

  if (input == "-") {
    fasttext.test(std::cin, k, threshold, meter);
  } else {
    std::ifstream ifs(input);
    if (!ifs.is_open()) {
      std::cerr << "Test file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.test(ifs, k, threshold, meter);
  }

  if (perLabel) {
    std::cout << std::fixed << std::setprecision(6);
    auto writeMetric = [](const std::string& name, double value) {
      std::cout << name << " : ";
      if (std::isfinite(value)) {
        std::cout << value;
      } else {
        std::cout << "--------";
      }
      std::cout << "  ";
    };

    std::shared_ptr<const Dictionary> dict = fasttext.getDictionary();
    for (int32_t labelId = 0; labelId < dict->nlabels(); labelId++) {
      writeMetric("F1-Score", meter.f1Score(labelId));
      writeMetric("Precision", meter.precision(labelId));
      writeMetric("Recall", meter.recall(labelId));
      std::cout << " " << dict->getLabel(labelId) << std::endl;
    }
  }
  meter.writeGeneralMetrics(std::cout, k);

  exit(0);
}